

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O1

void __thiscall CFileCollection::AddEntry(CFileCollection *this,int64 Timestamp)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long in_FS_OFFSET;
  char aTimestring [20];
  char aBuf [512];
  char local_248 [32];
  char local_228 [512];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_NumTimestamps == 0) {
    this->m_NumTimestamps = 1;
    this->m_aTimestamps[0] = Timestamp;
    goto LAB_001c3a89;
  }
  if (this->m_NumTimestamps == this->m_MaxEntries) {
    BuildTimestring(this,this->m_aTimestamps[0],local_248);
    str_format(local_228,0x200,"%s/%s_%s%s",this->m_aPath,this->m_aFileDesc,local_248,
               this->m_aFileExt);
    (*(this->m_pStorage->super_IInterface)._vptr_IInterface[9])(this->m_pStorage,local_228,0);
  }
  iVar1 = this->m_NumTimestamps;
  lVar5 = (long)iVar1;
  if (Timestamp < this->m_aTimestamps[0]) {
    if (this->m_MaxEntries <= iVar1) goto LAB_001c3a89;
    mem_move(this->m_aTimestamps + 1,this,iVar1 * 8);
    this->m_aTimestamps[0] = Timestamp;
  }
  else {
    uVar3 = lVar5 - 1;
    iVar2 = (int)uVar3;
    if (this->m_aTimestamps[lVar5 + -1] <= Timestamp) {
      if (iVar1 == this->m_MaxEntries) {
        mem_move(this,this->m_aTimestamps + 1,iVar2 << 3);
        this->m_aTimestamps[(long)this->m_NumTimestamps + -1] = Timestamp;
      }
      else {
        this->m_NumTimestamps = iVar1 + 1;
        this->m_aTimestamps[lVar5] = Timestamp;
      }
      goto LAB_001c3a89;
    }
    if (2 < iVar1) {
      uVar4 = 0;
      do {
        uVar6 = (int)(uVar4 + (int)uVar3) / 2;
        if (Timestamp < this->m_aTimestamps[(int)uVar6]) {
          uVar3 = (ulong)uVar6;
          uVar6 = uVar4;
        }
        uVar4 = uVar6;
        iVar2 = (int)uVar3;
      } while (1 < (int)(iVar2 - uVar4));
    }
    if (iVar1 == this->m_MaxEntries) {
      mem_move(this,this->m_aTimestamps + 1,iVar2 * 8 - 8);
      this->m_aTimestamps[(long)iVar2 + -1] = Timestamp;
      goto LAB_001c3a89;
    }
    mem_move(this->m_aTimestamps + iVar2 + 1,this->m_aTimestamps + iVar2,(iVar1 - iVar2) * 8);
    this->m_aTimestamps[iVar2] = Timestamp;
  }
  this->m_NumTimestamps = this->m_NumTimestamps + 1;
LAB_001c3a89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CFileCollection::AddEntry(int64 Timestamp)
{
	if(m_NumTimestamps == 0)
	{
		// empty list
		m_aTimestamps[m_NumTimestamps++] = Timestamp;
	}
	else
	{
		// remove old file
		if(m_NumTimestamps == m_MaxEntries)
		{
			char aBuf[IO_MAX_PATH_LENGTH];
			char aTimestring[TIMESTAMP_LENGTH];
			BuildTimestring(m_aTimestamps[0], aTimestring);
			str_format(aBuf, sizeof(aBuf), "%s/%s_%s%s", m_aPath, m_aFileDesc, aTimestring, m_aFileExt);
			m_pStorage->RemoveFile(aBuf, IStorage::TYPE_SAVE);
		}

		// add entry to the sorted list
		if(m_aTimestamps[0] > Timestamp)
		{
			// first entry
			if(m_NumTimestamps < m_MaxEntries)
			{
				mem_move(m_aTimestamps+1, m_aTimestamps, m_NumTimestamps*sizeof(int64));
				m_aTimestamps[0] = Timestamp;
				++m_NumTimestamps;
			}
		}
		else if(m_aTimestamps[m_NumTimestamps-1] <= Timestamp)
		{
			// last entry
			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (m_NumTimestamps-1)*sizeof(int64));
				m_aTimestamps[m_NumTimestamps-1] = Timestamp;
			}
			else
				m_aTimestamps[m_NumTimestamps++] = Timestamp;
		}
		else
		{
			// middle entry
			int Left = 0, Right = m_NumTimestamps-1;
			while(Right-Left > 1)
			{
				int Mid = (Left+Right)/2;
				if(m_aTimestamps[Mid] > Timestamp)
					Right = Mid;
				else
					Left = Mid;
			}

			if(m_NumTimestamps == m_MaxEntries)
			{
				mem_move(m_aTimestamps, m_aTimestamps+1, (Right-1)*sizeof(int64));
				m_aTimestamps[Right-1] = Timestamp;
			}
			else
			{
				mem_move(m_aTimestamps+Right+1, m_aTimestamps+Right, (m_NumTimestamps-Right)*sizeof(int64));
				m_aTimestamps[Right] = Timestamp;
				++m_NumTimestamps;
			}
		}
	}
}